

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_pad::build_graph(test_pad *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne_a)._M_elems)
  ;
  ggml_set_name(pgVar1,"a");
  pgVar1 = (ggml_tensor *)ggml_pad(ctx,pgVar1,this->pad_0,this->pad_1,0,0);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne_a.data());
        ggml_set_name(a, "a");

        ggml_tensor * out = ggml_pad(ctx, a, pad_0, pad_1, 0, 0);
        ggml_set_name(out, "out");

        return out;
    }